

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

BBox * __thiscall CGL::GLScene::Mesh::get_bbox(BBox *__return_storage_ptr__,Mesh *this)

{
  _List_node_base *p_Var1;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_48;
  
  (__return_storage_ptr__->max).field_0.field_0.x = -INFINITY;
  (__return_storage_ptr__->max).field_0.field_0.y = -INFINITY;
  (__return_storage_ptr__->max).field_0.field_0.z = -INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.x = INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.y = INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.z = INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.x = -INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.y = -INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.z = -INFINITY;
  for (p_Var1 = (this->mesh).vertices.super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->mesh).vertices; p_Var1 = p_Var1->_M_next) {
    local_48.field_0.x = (double)p_Var1[2]._M_next;
    local_48.field_0.y = (double)p_Var1[2]._M_prev;
    local_48.field_0.z = (double)p_Var1[3]._M_next;
    BBox::expand(__return_storage_ptr__,(Vector3D *)&local_48.field_0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}